

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition.hxx
# Opt level: O0

Index __thiscall
andres::Partition<unsigned_long>::find(Partition<unsigned_long> *this,Index element)

{
  value_type vVar1;
  reference pvVar2;
  size_type in_RSI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  Index tmp;
  Index root;
  size_type local_18;
  size_type local_10;
  
  local_18 = in_RSI;
  while (pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            (in_RDI,local_18), local_10 = in_RSI, *pvVar2 != local_18) {
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in_RDI,local_18)
    ;
    local_18 = *pvVar2;
  }
  while (local_10 != local_18) {
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in_RDI,local_10)
    ;
    vVar1 = *pvVar2;
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in_RDI,local_10)
    ;
    *pvVar2 = local_18;
    local_10 = vVar1;
  }
  return local_18;
}

Assistant:

inline typename Partition<T>::Index
Partition<T>::find(
    Index element // copy to work with
) {
    // find the root
    Index root = element;
    while(parents_[static_cast<std::size_t>(root)] != root) {
        root = parents_[static_cast<std::size_t>(root)];
    }
    // path compression
    while(element != root) {
        const Index tmp = parents_[static_cast<std::size_t>(element)];
        parents_[static_cast<std::size_t>(element)] = root;
        element = tmp;
    }
    return root;
}